

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

void __thiscall TCMallocTest_Ranges_Test::TestBody(TCMallocTest_Ranges_Test *this)

{
  byte bVar1;
  void *ptr;
  void *ptr_00;
  TestingPortal *pTVar2;
  long *plVar3;
  size_t min_size;
  size_t min_size_00;
  size_t min_size_01;
  size_t min_size_02;
  size_t min_size_03;
  size_t min_size_04;
  size_t min_size_05;
  size_t min_size_06;
  code *local_38;
  
  ptr = malloc(0x100000);
  ptr_00 = malloc(0x100000);
  pTVar2 = tcmalloc::TestingPortal::Get();
  bVar1 = (*(code *)**(undefined8 **)pTVar2)(pTVar2);
  CheckRangeCallback(ptr,INUSE,min_size);
  CheckRangeCallback(ptr_00,INUSE,min_size_00);
  local_38 = free;
  (*noopt_helper)(&local_38);
  (*local_38)(ptr);
  CheckRangeCallback(ptr,FREE,min_size_01);
  CheckRangeCallback(ptr_00,INUSE,min_size_02);
  plVar3 = (long *)MallocExtension::instance();
  (**(code **)(*plVar3 + 0x90))(plVar3);
  CheckRangeCallback(ptr,bVar1 + FREE,min_size_03);
  CheckRangeCallback(ptr_00,INUSE,min_size_04);
  local_38 = free;
  (*noopt_helper)(&local_38);
  (*local_38)(ptr_00);
  CheckRangeCallback(ptr,bVar1 + FREE,min_size_05);
  CheckRangeCallback(ptr_00,FREE,min_size_06);
  return;
}

Assistant:

TEST(TCMallocTest, Ranges) {
  static const int MB = 1048576;
  void* a = malloc(MB);
  void* b = malloc(MB);
  base::MallocRange::Type releasedType =
    TestingPortal::Get()->HaveSystemRelease() ? base::MallocRange::UNMAPPED : base::MallocRange::FREE;

  CheckRangeCallback(a, base::MallocRange::INUSE, MB);
  CheckRangeCallback(b, base::MallocRange::INUSE, MB);

  (noopt(free))(a);

  CheckRangeCallback(a, base::MallocRange::FREE, MB);
  CheckRangeCallback(b, base::MallocRange::INUSE, MB);

  MallocExtension::instance()->ReleaseFreeMemory();

  CheckRangeCallback(a, releasedType, MB);
  CheckRangeCallback(b, base::MallocRange::INUSE, MB);

  (noopt(free))(b);

  CheckRangeCallback(a, releasedType, MB);
  CheckRangeCallback(b, base::MallocRange::FREE, MB);
}